

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  FieldType type;
  FieldDescriptor *pFVar1;
  ArenaImpl *pAVar2;
  byte bVar3;
  CppType CVar4;
  int iVar5;
  Extension *pEVar6;
  LogMessage *pLVar7;
  RepeatedField<int> *this_00;
  RepeatedField<unsigned_long> *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar8;
  RepeatedField<long> *this_02;
  RepeatedField<unsigned_int> *this_03;
  RepeatedField<bool> *this_04;
  RepeatedField<double> *this_05;
  RepeatedField<float> *this_06;
  string *psVar9;
  MessageLite *pMVar10;
  Type *pTVar11;
  Type *pTVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int64 iVar13;
  undefined4 extraout_var_03;
  _func_int **pp_Var14;
  int i;
  int iVar15;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar16;
  string local_98;
  LogMessage local_78;
  ExtensionSet *local_40;
  LogFinisher local_31;
  undefined4 extraout_var;
  undefined4 extraout_var_02;
  
  if (other_extension->is_repeated == true) {
    pFVar1 = other_extension->descriptor;
    local_40 = this;
    pVar16 = Insert(this,number);
    pEVar6 = pVar16.first;
    pEVar6->descriptor = pFVar1;
    if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (pEVar6->type != other_extension->type) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                   ,0x3ab);
        pLVar7 = LogMessage::operator<<
                           (&local_78,"CHECK failed: (extension->type) == (other_extension.type): ")
        ;
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      if (pEVar6->is_packed != other_extension->is_packed) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                   ,0x3ac);
        pLVar7 = LogMessage::operator<<
                           (&local_78,
                            "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ")
        ;
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      if (pEVar6->is_repeated == false) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                   ,0x3ad);
        pLVar7 = LogMessage::operator<<(&local_78,"CHECK failed: extension->is_repeated: ");
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
    }
    else {
      pEVar6->type = other_extension->type;
      pEVar6->is_packed = other_extension->is_packed;
      pEVar6->is_repeated = true;
    }
    CVar4 = anon_unknown_22::cpp_type(other_extension->type);
    switch(CVar4) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_00 = (pEVar6->field_0).repeated_int32_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_00 = (RepeatedField<int> *)operator_new(0x10);
          this_00->current_size_ = 0;
          this_00->total_size_ = 0;
          this_00->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook((Arena *)pAVar2,(type_info *)&RepeatedField<int>::typeinfo,0x10);
          this_00 = (RepeatedField<int> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<int>>);
          this_00->current_size_ = 0;
          this_00->total_size_ = 0;
          this_00->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00;
      }
      RepeatedField<int>::MergeFrom(this_00,(other_extension->field_0).repeated_int32_value);
      return;
    case CPPTYPE_INT64:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_02 = (pEVar6->field_0).repeated_int64_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_02 = (RepeatedField<long> *)operator_new(0x10);
          this_02->current_size_ = 0;
          this_02->total_size_ = 0;
          this_02->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook((Arena *)pAVar2,(type_info *)&RepeatedField<long>::typeinfo,0x10);
          this_02 = (RepeatedField<long> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<long>>);
          this_02->current_size_ = 0;
          this_02->total_size_ = 0;
          this_02->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_02;
      }
      RepeatedField<long>::MergeFrom(this_02,(other_extension->field_0).repeated_int64_value);
      return;
    case CPPTYPE_UINT32:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_03 = (pEVar6->field_0).repeated_uint32_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_03 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          this_03->current_size_ = 0;
          this_03->total_size_ = 0;
          this_03->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook((Arena *)pAVar2,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10)
          ;
          this_03 = (RepeatedField<unsigned_int> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>)
          ;
          this_03->current_size_ = 0;
          this_03->total_size_ = 0;
          this_03->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_03;
      }
      RepeatedField<unsigned_int>::MergeFrom
                (this_03,(other_extension->field_0).repeated_uint32_value);
      return;
    case CPPTYPE_UINT64:
      goto switchD_00148340_caseD_4;
    case CPPTYPE_DOUBLE:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_05 = (pEVar6->field_0).repeated_double_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_05 = (RepeatedField<double> *)operator_new(0x10);
          this_05->current_size_ = 0;
          this_05->total_size_ = 0;
          this_05->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook((Arena *)pAVar2,(type_info *)&RepeatedField<double>::typeinfo,0x10);
          this_05 = (RepeatedField<double> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<double>>);
          this_05->current_size_ = 0;
          this_05->total_size_ = 0;
          this_05->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_05;
      }
      RepeatedField<double>::MergeFrom(this_05,(other_extension->field_0).repeated_double_value);
      return;
    case CPPTYPE_FLOAT:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_06 = (pEVar6->field_0).repeated_float_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_06 = (RepeatedField<float> *)operator_new(0x10);
          this_06->current_size_ = 0;
          this_06->total_size_ = 0;
          this_06->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook((Arena *)pAVar2,(type_info *)&RepeatedField<float>::typeinfo,0x10);
          this_06 = (RepeatedField<float> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<float>>);
          this_06->current_size_ = 0;
          this_06->total_size_ = 0;
          this_06->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_06;
      }
      RepeatedField<float>::MergeFrom(this_06,(other_extension->field_0).repeated_float_value);
      return;
    case CPPTYPE_BOOL:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_04 = (pEVar6->field_0).repeated_bool_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          this_04 = (RepeatedField<bool> *)operator_new(0x10);
          this_04->current_size_ = 0;
          this_04->total_size_ = 0;
          this_04->arena_or_elements_ = (void *)0x0;
        }
        else {
          Arena::AllocHook((Arena *)pAVar2,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
          this_04 = (RepeatedField<bool> *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (pAVar2,0x10,
                               arena_destruct_object<google::protobuf::RepeatedField<bool>>);
          this_04->current_size_ = 0;
          this_04->total_size_ = 0;
          this_04->arena_or_elements_ = pAVar2;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_04;
      }
      RepeatedField<bool>::MergeFrom(this_04,(other_extension->field_0).repeated_bool_value);
      return;
    case CPPTYPE_STRING:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        psVar9 = (pEVar6->field_0).string_value;
      }
      else {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          psVar9 = (string *)operator_new(0x18);
          (psVar9->_M_dataplus)._M_p = (pointer)0x0;
          psVar9->_M_string_length = 0;
          (psVar9->field_2)._M_allocated_capacity = 0;
        }
        else {
          Arena::AllocHook((Arena *)pAVar2,
                           (type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18);
          psVar9 = (string *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (pAVar2,0x18,
                              arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                             );
          (psVar9->_M_dataplus)._M_p = (pointer)pAVar2;
          psVar9->_M_string_length = 0;
          (psVar9->field_2)._M_allocated_capacity = 0;
        }
        (pEVar6->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)psVar9;
      }
      RepeatedPtrFieldBase::
      MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)psVar9,
                 (RepeatedPtrFieldBase *)(other_extension->field_0).string_value);
      return;
    case CPPTYPE_MESSAGE:
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pAVar2 = (ArenaImpl *)local_40->arena_;
        if (pAVar2 == (ArenaImpl *)0x0) {
          pRVar8 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)operator_new(0x18);
          (pRVar8->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
          (pRVar8->super_RepeatedPtrFieldBase).current_size_ = 0;
          (pRVar8->super_RepeatedPtrFieldBase).total_size_ = 0;
          (pRVar8->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
        }
        else {
          Arena::AllocHook((Arena *)pAVar2,
                           (type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,
                           0x18);
          pRVar8 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)ArenaImpl::AllocateAlignedAndAddCleanup
                                (pAVar2,0x18,
                                 arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                                );
          (pRVar8->super_RepeatedPtrFieldBase).arena_ = (Arena *)pAVar2;
          (pRVar8->super_RepeatedPtrFieldBase).current_size_ = 0;
          (pRVar8->super_RepeatedPtrFieldBase).total_size_ = 0;
          (pRVar8->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
        }
        (pEVar6->field_0).repeated_string_value = pRVar8;
      }
      psVar9 = (other_extension->field_0).string_value;
      for (iVar15 = 0; iVar15 < (int)psVar9->_M_string_length; iVar15 = iVar15 + 1) {
        pTVar11 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar9,iVar15);
        pTVar12 = RepeatedPtrFieldBase::
                  AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                            ((RepeatedPtrFieldBase *)(pEVar6->field_0).string_value);
        if (pTVar12 == (Type *)0x0) {
          iVar5 = (*pTVar11->_vptr_MessageLite[4])(pTVar11,local_40->arena_);
          pTVar12 = (Type *)CONCAT44(extraout_var_00,iVar5);
          RepeatedPtrFieldBase::
          AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                    ((RepeatedPtrFieldBase *)(pEVar6->field_0).int64_value,pTVar12);
        }
        (*pTVar12->_vptr_MessageLite[8])(pTVar12,pTVar11);
      }
      return;
    default:
      return;
    }
  }
  if ((other_extension->field_0xa & 1) != 0) {
    return;
  }
  CVar4 = anon_unknown_22::cpp_type(other_extension->type);
  switch(CVar4) {
  case CPPTYPE_INT32:
    SetInt32(this,number,other_extension->type,(other_extension->field_0).int32_value,
             other_extension->descriptor);
    return;
  case CPPTYPE_INT64:
    SetInt64(this,number,other_extension->type,(other_extension->field_0).int64_value,
             other_extension->descriptor);
    return;
  case CPPTYPE_UINT32:
    SetUInt32(this,number,other_extension->type,(other_extension->field_0).uint32_value,
              other_extension->descriptor);
    return;
  case CPPTYPE_UINT64:
    SetUInt64(this,number,other_extension->type,(other_extension->field_0).uint64_value,
              other_extension->descriptor);
    return;
  case CPPTYPE_DOUBLE:
    SetDouble(this,number,other_extension->type,(other_extension->field_0).double_value,
              other_extension->descriptor);
    return;
  case CPPTYPE_FLOAT:
    SetFloat(this,number,other_extension->type,(other_extension->field_0).float_value,
             other_extension->descriptor);
    return;
  case CPPTYPE_BOOL:
    SetBool(this,number,other_extension->type,(other_extension->field_0).bool_value,
            other_extension->descriptor);
    return;
  case CPPTYPE_ENUM:
    SetEnum(this,number,other_extension->type,(other_extension->field_0).enum_value,
            other_extension->descriptor);
    return;
  case CPPTYPE_STRING:
    type = other_extension->type;
    std::__cxx11::string::string
              ((string *)&local_98,(string *)(other_extension->field_0).string_value);
    SetString(this,number,type,&local_98,other_extension->descriptor);
    std::__cxx11::string::~string((string *)&local_98);
    break;
  case CPPTYPE_MESSAGE:
    pFVar1 = other_extension->descriptor;
    pVar16 = Insert(this,number);
    pEVar6 = pVar16.first;
    pEVar6->descriptor = pFVar1;
    if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (pEVar6->type != other_extension->type) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                   ,0x40a);
        pLVar7 = LogMessage::operator<<
                           (&local_78,"CHECK failed: (extension->type) == (other_extension.type): ")
        ;
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      if (pEVar6->is_packed != other_extension->is_packed) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                   ,0x40b);
        pLVar7 = LogMessage::operator<<
                           (&local_78,
                            "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ")
        ;
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      if (pEVar6->is_repeated == true) {
        LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                   ,0x40c);
        pLVar7 = LogMessage::operator<<(&local_78,"CHECK failed: !extension->is_repeated: ");
        LogFinisher::operator=(&local_31,pLVar7);
        LogMessage::~LogMessage(&local_78);
      }
      pMVar10 = (pEVar6->field_0).message_value;
      if ((other_extension->field_0xa & 0x10) == 0) {
        if ((pEVar6->field_0xa & 0x10) != 0) {
          iVar15 = (*pMVar10->_vptr_MessageLite[4])(pMVar10);
          pMVar10 = (MessageLite *)CONCAT44(extraout_var_03,iVar15);
          goto LAB_00148ab8;
        }
        (*pMVar10->_vptr_MessageLite[8])();
      }
      else {
        if ((pEVar6->field_0xa & 0x10) == 0) {
          iVar15 = (*((other_extension->field_0).message_value)->_vptr_MessageLite[3])
                             ((other_extension->field_0).message_value,pMVar10);
          iVar13 = CONCAT44(extraout_var_02,iVar15);
          pp_Var14 = pMVar10->_vptr_MessageLite;
          goto LAB_00148ac1;
        }
        (*pMVar10->_vptr_MessageLite[0xd])(pMVar10);
      }
    }
    else {
      pEVar6->type = other_extension->type;
      pEVar6->is_packed = other_extension->is_packed;
      pEVar6->is_repeated = false;
      bVar3 = pEVar6->field_0xa & 0xf;
      if ((other_extension->field_0xa & 0x10) == 0) {
        pEVar6->field_0xa = bVar3;
        iVar15 = (*((other_extension->field_0).message_value)->_vptr_MessageLite[4])
                           ((other_extension->field_0).message_value,this->arena_);
        pMVar10 = (MessageLite *)CONCAT44(extraout_var,iVar15);
        (pEVar6->field_0).message_value = pMVar10;
LAB_00148ab8:
        iVar13 = (other_extension->field_0).int64_value;
        pp_Var14 = pMVar10->_vptr_MessageLite;
LAB_00148ac1:
        (*pp_Var14[8])(pMVar10,iVar13);
      }
      else {
        pEVar6->field_0xa = bVar3 | 0x10;
        iVar15 = (*((other_extension->field_0).message_value)->_vptr_MessageLite[2])
                           ((other_extension->field_0).message_value,this->arena_);
        pMVar10 = (MessageLite *)CONCAT44(extraout_var_01,iVar15);
        (pEVar6->field_0).message_value = pMVar10;
        (*pMVar10->_vptr_MessageLite[0xd])(pMVar10,(other_extension->field_0).int64_value);
      }
    }
    pEVar6->field_0xa = pEVar6->field_0xa & 0xf0;
  }
  return;
switchD_00148340_caseD_4:
  if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    this_01 = (pEVar6->field_0).repeated_uint64_value;
  }
  else {
    pAVar2 = (ArenaImpl *)local_40->arena_;
    if (pAVar2 == (ArenaImpl *)0x0) {
      this_01 = (RepeatedField<unsigned_long> *)operator_new(0x10);
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->arena_or_elements_ = (void *)0x0;
    }
    else {
      Arena::AllocHook((Arena *)pAVar2,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
      this_01 = (RepeatedField<unsigned_long> *)
                ArenaImpl::AllocateAlignedAndAddCleanup
                          (pAVar2,0x10,
                           arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>);
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->arena_or_elements_ = pAVar2;
    }
    (pEVar6->field_0).repeated_string_value =
         (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this_01;
  }
  RepeatedField<unsigned_long>::MergeFrom(this_01,(other_extension->field_0).repeated_uint64_value);
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
    int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new =
        MaybeNewExtension(number, other_extension.descriptor, &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE) \
  case WireFormatLite::CPPTYPE_##UPPERCASE:              \
    if (is_new) {                                        \
      extension->repeated_##LOWERCASE##_value =          \
          Arena::CreateMessage<REPEATED_TYPE>(arena_);   \
    }                                                    \
    extension->repeated_##LOWERCASE##_value->MergeFrom(  \
        *other_extension.repeated_##LOWERCASE##_value);  \
    break;

      HANDLE_TYPE(INT32, int32, RepeatedField<int32>);
      HANDLE_TYPE(INT64, int64, RepeatedField<int64>);
      HANDLE_TYPE(UINT32, uint32, RepeatedField<uint32>);
      HANDLE_TYPE(UINT64, uint64, RepeatedField<uint64>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target =
              reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                  extension->repeated_message_value)
                  ->AddFromCleared<GenericTypeHandler<MessageLite>>();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)  \
  case WireFormatLite::CPPTYPE_##UPPERCASE:           \
    Set##CAMELCASE(number, other_extension.type,      \
                   other_extension.LOWERCASE##_value, \
                   other_extension.descriptor);       \
    break;

        HANDLE_TYPE(INT32, int32, Int32);
        HANDLE_TYPE(INT64, int64, Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE(FLOAT, float, Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(BOOL, bool, Bool);
        HANDLE_TYPE(ENUM, enum, Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type, *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new =
              MaybeNewExtension(number, other_extension.descriptor, &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value
                    ->MutableMessage(*other_extension.message_value)
                    ->CheckTypeAndMergeFrom(*other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}